

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa.c
# Opt level: O3

PaError GetAlsaStreamPointer(PaStream *s,PaAlsaStream **stream)

{
  PaUtilHostApiRepresentation *pPVar1;
  PaUtilHostApiRepresentation *in_RAX;
  PaUtilHostApiRepresentation *pPVar2;
  char *format;
  PaUtilHostApiRepresentation *hostApi;
  PaUtilHostApiRepresentation *local_18;
  
  local_18 = in_RAX;
  paUtilErr_ = PaUtil_ValidateStreamPointer(s);
  if (paUtilErr_ < 0) {
    PaUtil_DebugPrint(
                     "Expression \'PaUtil_ValidateStreamPointer( s )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 4708\n"
                     );
  }
  paUtilErr_ = PaUtil_GetHostApiRepresentation(&local_18,paALSA);
  if (paUtilErr_ < 0) {
    format = 
    "Expression \'PaUtil_GetHostApiRepresentation( &hostApi, paALSA )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 4709\n"
    ;
  }
  else {
    pPVar1 = *(PaUtilHostApiRepresentation **)((long)s + 0x10);
    pPVar2 = local_18 + 2;
    if (pPVar1 == pPVar2 || pPVar1 == local_18 + 1) {
      *stream = (PaAlsaStream *)s;
      return (PaError)CONCAT71((int7)((ulong)pPVar2 >> 8),pPVar1 != pPVar2 && pPVar1 != local_18 + 1
                              );
    }
    format = 
    "Expression \'PA_STREAM_REP( s )->streamInterface == &alsaHostApi->callbackStreamInterface || PA_STREAM_REP( s )->streamInterface == &alsaHostApi->blockingStreamInterface\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 4714\n"
    ;
  }
  PaUtil_DebugPrint(format);
}

Assistant:

static PaError GetAlsaStreamPointer( PaStream* s, PaAlsaStream** stream )
{
    PaError result = paNoError;
    PaUtilHostApiRepresentation* hostApi;
    PaAlsaHostApiRepresentation* alsaHostApi;

    PA_ENSURE( PaUtil_ValidateStreamPointer( s ) );
    PA_ENSURE( PaUtil_GetHostApiRepresentation( &hostApi, paALSA ) );
    alsaHostApi = (PaAlsaHostApiRepresentation*)hostApi;

    PA_UNLESS( PA_STREAM_REP( s )->streamInterface == &alsaHostApi->callbackStreamInterface
            || PA_STREAM_REP( s )->streamInterface == &alsaHostApi->blockingStreamInterface,
        paIncompatibleStreamHostApi );

    *stream = (PaAlsaStream*)s;
error:
    return paNoError;
}